

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONOutlines(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  mapped_type *pmVar1;
  _Alloc_hider _Var2;
  int iVar3;
  allocator<char> local_e9;
  JSON j_outlines;
  QPDFOutlineDocumentHelper odh;
  string local_b8;
  Pipeline *local_98;
  bool *local_90;
  QPDFJob *local_88;
  QPDF *local_80;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_78;
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  page_numbers;
  
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &page_numbers._M_t._M_impl.super__Rb_tree_header._M_header;
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = p;
  local_90 = first;
  local_88 = this;
  page_numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       page_numbers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&odh,pdf);
  local_80 = pdf;
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_b8,
             (QPDFPageDocumentHelper *)&odh);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&odh);
  iVar3 = 1;
  for (_Var2._M_p = local_b8._M_dataplus._M_p; _Var2._M_p != (pointer)local_b8._M_string_length;
      _Var2._M_p = _Var2._M_p + 0x38) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&odh,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(_Var2._M_p + 8));
    j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&odh);
    pmVar1 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&page_numbers,(key_type *)&j_outlines);
    *pmVar1 = iVar3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&odh.super_QPDFDocumentHelper.qpdf);
    iVar3 = iVar3 + 1;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_b8);
  JSON::makeArray();
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&odh,local_80);
  QPDFOutlineDocumentHelper::getTopLevelOutlines(&local_78,&odh);
  addOutlinesToJson(local_88,&local_78,&j_outlines,&page_numbers);
  std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector(&local_78)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"outlines",&local_e9);
  JSON::writeDictionaryItem(local_98,local_90,&local_b8,&j_outlines,1);
  std::__cxx11::string::~string((string *)&local_b8);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&odh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
  ::~_Rb_tree(&page_numbers._M_t);
  return;
}

Assistant:

void
QPDFJob::doJSONOutlines(Pipeline* p, bool& first, QPDF& pdf)
{
    std::map<QPDFObjGen, int> page_numbers;
    int n = 0;
    for (auto const& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        QPDFObjectHandle oh = ph.getObjectHandle();
        page_numbers[oh.getObjGen()] = ++n;
    }

    JSON j_outlines = JSON::makeArray();
    QPDFOutlineDocumentHelper odh(pdf);
    addOutlinesToJson(odh.getTopLevelOutlines(), j_outlines, page_numbers);
    JSON::writeDictionaryItem(p, first, "outlines", j_outlines, 1);
}